

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O1

bfile_t * bf_create_r(char *filename)

{
  FILE *pFVar1;
  bfile_t *pbVar2;
  uint8_t *puVar3;
  size_t sVar4;
  char *__dest;
  stat buf;
  stat sStack_a8;
  
  pFVar1 = fopen(filename,"rb");
  if (pFVar1 == (FILE *)0x0) {
    pbVar2 = (bfile_t *)0x0;
  }
  else {
    pbVar2 = (bfile_t *)malloc(0x50);
    pbVar2->flags = 0;
    pbVar2->file = (FILE *)0x0;
    pbVar2->size = 0;
    pbVar2->pos = 0;
    pbVar2->ipos = 0;
    pbVar2->filename = (char *)0x0;
    puVar3 = (uint8_t *)malloc(0x1000);
    pbVar2->buffer = puVar3;
    pbVar2->buffer_size = 0x1000;
    pbVar2->progress_cb = (_func_int_float_void_ptr *)0x0;
    pbVar2->progress_data = (void *)0x0;
    pbVar2->file = (FILE *)pFVar1;
    sVar4 = strlen(filename);
    __dest = (char *)malloc(sVar4 + 1);
    pbVar2->filename = __dest;
    strcpy(__dest,filename);
    stat(filename,&sStack_a8);
    pbVar2->size = sStack_a8.st_size;
    pbVar2->flags = 0x100;
  }
  return pbVar2;
}

Assistant:

bfile_t *
bf_create_r(
    const char * filename )
{
    bfile_t * bfile;
    FILE * file;
    struct stat buf;

    bfile = NULL;
    file = fopen( filename, "rb" );
    if ( file ) {
        bfile = create_bfile_t( BFILE_BLOCK_SIZE );
        bfile->file = file;
        bfile->filename = (char *)malloc( strlen( filename ) + 1 );
        assert( bfile->filename );
        strcpy( bfile->filename, filename );
        stat( filename, &buf );
        bfile->size = buf.st_size;
        bfile->flags |= BF_READABLE;
    }

    return bfile;
}